

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit_editor.cpp
# Opt level: O0

uptr_t __thiscall
lsim::gui::CircuitEditorFactory::create_circuit(CircuitEditorFactory *this,ModelCircuit *circuit)

{
  bool bVar1;
  reference puVar2;
  ModelComponent *component_model;
  pointer this_00;
  ModelComponent *comp;
  uint *comp_id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  undefined1 local_38 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> comp_ids;
  __single_object editor;
  ModelCircuit *circuit_local;
  
  std::make_unique<lsim::gui::CircuitEditor,lsim::ModelCircuit*&>
            ((ModelCircuit **)
             &comp_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ModelCircuit::component_ids
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,circuit);
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  comp_id = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&comp_id);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    component_model = ModelCircuit::component_by_id(circuit,*puVar2);
    this_00 = std::
              unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>::
              operator->((unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>
                          *)&comp_ids.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
    CircuitEditor::create_widget_for_component(this_00,component_model);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  }
  std::unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>::
  unique_ptr((unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_> *
             )this,(unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>
                    *)&comp_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  std::unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>::
  ~unique_ptr((unique_ptr<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>_>
               *)&comp_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  return (__uniq_ptr_data<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>,_true,_true>
          )(__uniq_ptr_data<lsim::gui::CircuitEditor,_std::default_delete<lsim::gui::CircuitEditor>,_true,_true>
            )this;
}

Assistant:

CircuitEditor::uptr_t CircuitEditorFactory::create_circuit(ModelCircuit *circuit) {
	auto editor = std::make_unique<CircuitEditor>(circuit);

	auto comp_ids = circuit->component_ids();
    for (const auto &comp_id : comp_ids) {
		auto comp = circuit->component_by_id(comp_id);
		editor->create_widget_for_component(comp);
	}

    return std::move(editor);
}